

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_commit.cxx
# Opt level: O3

void __thiscall
level_mesh::create_mappings
          (level_mesh *this,lw_face_vec *faces,lw_vmref_vec *vmrefs,xr_vmap_vec *vmaps,
          xr_remapper *face_remap,xr_remapper *vert_remap)

{
  pointer *pp_Var1;
  uint32_t vert_idx;
  uint uVar2;
  pointer puVar3;
  pointer pbVar4;
  iterator iVar5;
  pointer p_Var6;
  lw_vmref_entry lVar7;
  lw_vmref_entry lVar8;
  long lVar9;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  lw_vmref_entry this_00;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint *puVar17;
  uint uVar18;
  bool bVar19;
  lw_vmref vmref;
  lw_vmref vmref0;
  uint local_ec;
  lw_vmref_entry local_c8;
  _svector<xray_re::lw_vmref_entry,_5U> local_b8;
  uint *local_88;
  xr_remapper *local_80;
  uint *local_78;
  lw_vmref_entry local_70;
  lw_face_vec *local_68;
  _svector<xray_re::lw_vmref_entry,_5U> local_5c;
  
  uVar15 = (ulong)vert_remap->m_min;
  puVar3 = (this->super_xr_mesh_builder).m_vertex_faces.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 + uVar15 != puVar3 + (ulong)vert_remap->m_max + 1) {
    puVar17 = puVar3 + vert_remap->m_max;
    this_00.vmap = 0;
    this_00.offset = 0;
    local_c8.vmap = 0;
    local_c8.offset = 0;
    local_78 = puVar3 + uVar15;
    local_88 = puVar17;
    local_80 = vert_remap;
    local_68 = faces;
    do {
      uVar10 = *local_78;
      uVar18 = (uint)uVar15;
      if ((((uVar10 != 0xffffffff) && (vert_remap->m_min <= uVar18)) &&
          (uVar18 <= vert_remap->m_max)) &&
         (vert_idx = vert_remap->m_mapping[uVar18 - vert_remap->m_min], vert_idx != 0xffffffff)) {
        local_5c.count = 0;
        local_ec = 0xffffffff;
        iVar16 = 0;
        do {
          uVar15 = (ulong)uVar10;
          pbVar4 = (this->super_xr_mesh_builder).m_faces.
                   super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((uVar10 < face_remap->m_min) || (face_remap->m_max < uVar10)) {
LAB_0012c612:
            lVar14 = 3;
            do {
              bVar19 = lVar14 == 0;
              lVar14 = lVar14 + -1;
              if (bVar19) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                              ,0xa4,
                              "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                             );
              }
            } while (*(uint *)((long)pbVar4 + lVar14 * 4 + uVar15 * 0x40) != uVar18);
          }
          else {
            uVar10 = face_remap->m_mapping[uVar10 - face_remap->m_min];
            if ((ulong)uVar10 == 0xffffffff) goto LAB_0012c612;
            lVar9 = 0;
            do {
              lVar14 = lVar9;
              if (lVar14 == -3) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                              ,0x9a,
                              "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                             );
              }
              lVar9 = lVar14 + -1;
            } while (*(uint *)((long)&pbVar4[uVar15].field_0 + lVar14 * 4 + 8) != uVar18);
            uVar2 = *(uint *)((long)&pbVar4[uVar15].field_0 + lVar14 * 4 + 0x20);
            uVar13 = (ulong)uVar2;
            if (uVar13 == 0xffffffff) {
              __assert_fail("tc != BAD_IDX",
                            "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_commit.cxx"
                            ,0x3a,
                            "void level_mesh::create_mappings(lw_face_vec &, lw_vmref_vec &, xr_vmap_vec &, const xr_remapper &, const xr_remapper &) const"
                           );
            }
            if (local_ec == 0xffffffff) {
              if (this_00 == (lw_vmref_entry)0x0) {
                this_00 = (lw_vmref_entry)operator_new(0x58);
                xray_re::xr_uv_vmap::xr_uv_vmap((xr_uv_vmap *)this_00,"Texture");
                local_b8.array[0] = this_00;
                std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
                emplace_back<xray_re::xr_vmap*>
                          ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)vmaps,
                           (xr_vmap **)&local_b8);
              }
              uVar11 = xray_re::xr_uv_vmap::add_uv
                                 ((xr_uv_vmap *)this_00,
                                  (this->super_xr_mesh_builder).m_texcoords.
                                  super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar13,vert_idx);
              uVar13 = (ulong)local_5c.count;
              if (4 < uVar13) {
LAB_0012c8f3:
                __assert_fail("count < N",
                              "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_fixed_vector.h"
                              ,0x5b,
                              "void xray_re::_svector<xray_re::lw_vmref_entry, 5>::push_back(const T &) [T = xray_re::lw_vmref_entry, N = 5]"
                             );
              }
              local_5c.count = local_5c.count + 1;
              local_5c.array[uVar13] = (lw_vmref_entry)((ulong)uVar11 << 0x20);
              iVar5._M_current =
                   (vmrefs->
                   super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              iVar16 = (int)((ulong)((long)iVar5._M_current -
                                    (long)(vmrefs->
                                          super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x45d1745d;
              iVar12 = iVar16;
              local_ec = uVar2;
              if (iVar5._M_current ==
                  (vmrefs->
                  super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                ::_M_realloc_insert<xray_re::_svector<xray_re::lw_vmref_entry,5u>const&>
                          ((vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                            *)vmrefs,iVar5,&local_5c);
              }
              else {
                lVar8.offset = local_5c.array[3].offset;
                lVar8.vmap = local_5c.array[3].vmap;
                *(ulong *)&(iVar5._M_current)->array[3].offset =
                     CONCAT44(local_5c.array[4].vmap,local_5c.array[3].offset);
                *(ulong *)&(iVar5._M_current)->array[4].offset =
                     CONCAT44(local_5c.count,local_5c.array[4].offset);
                (iVar5._M_current)->array[2] = local_5c.array[2];
                (iVar5._M_current)->array[3] = lVar8;
                (iVar5._M_current)->array[0] = local_5c.array[0];
                (iVar5._M_current)->array[1] = local_5c.array[1];
                pp_Var1 = &(vmrefs->
                           super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *pp_Var1 = *pp_Var1 + 1;
              }
            }
            else {
              iVar12 = iVar16;
              if (local_ec != uVar2) {
                local_70 = this_00;
                if (local_c8 == (lw_vmref_entry)0x0) {
                  local_c8 = (lw_vmref_entry)operator_new(0x70);
                  xray_re::xr_face_uv_vmap::xr_face_uv_vmap((xr_face_uv_vmap *)local_c8,"Texture");
                  local_b8.array[0] = local_c8;
                  std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
                  emplace_back<xray_re::xr_vmap*>
                            ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)vmaps,
                             (xr_vmap **)&local_b8);
                }
                local_b8.count = 0;
                uVar11 = xray_re::xr_face_uv_vmap::add_uv
                                   ((xr_face_uv_vmap *)local_c8,
                                    (this->super_xr_mesh_builder).m_texcoords.
                                    super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar13,vert_idx,
                                    uVar10);
                uVar13 = (ulong)local_b8.count;
                if (4 < uVar13) goto LAB_0012c8f3;
                local_b8.count = local_b8.count + 1;
                local_b8.array[uVar13] = (lw_vmref_entry)(((ulong)uVar11 << 0x20) + 1);
                iVar5._M_current =
                     (vmrefs->
                     super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                p_Var6 = (vmrefs->
                         super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (iVar5._M_current ==
                    (vmrefs->
                    super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                  ::_M_realloc_insert<xray_re::_svector<xray_re::lw_vmref_entry,5u>const&>
                            ((vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                              *)vmrefs,iVar5,&local_b8);
                }
                else {
                  lVar7.offset = local_b8.array[3].offset;
                  lVar7.vmap = local_b8.array[3].vmap;
                  *(ulong *)&(iVar5._M_current)->array[3].offset =
                       CONCAT44(local_b8.array[4].vmap,local_b8.array[3].offset);
                  *(ulong *)&(iVar5._M_current)->array[4].offset =
                       CONCAT44(local_b8.count,local_b8.array[4].offset);
                  (iVar5._M_current)->array[2] = local_b8.array[2];
                  (iVar5._M_current)->array[3] = lVar7;
                  (iVar5._M_current)->array[0] = local_b8.array[0];
                  (iVar5._M_current)->array[1] = local_b8.array[1];
                  pp_Var1 = &(vmrefs->
                             super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *pp_Var1 = *pp_Var1 + 1;
                }
                this_00 = local_70;
                iVar12 = (int)((ulong)((long)iVar5._M_current - (long)p_Var6) >> 2) * -0x45d1745d;
              }
            }
            *(int *)((long)&(local_68->
                            super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>)
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].field_0 +
                    lVar14 * 4 + 0x14) = iVar12;
            lVar14 = lVar14 + 2;
          }
          uVar10 = *(uint *)((long)&pbVar4[uVar15].field_0 + lVar14 * 4 + 0x24);
          vert_remap = local_80;
          puVar17 = local_88;
        } while (uVar10 != 0xffffffff);
      }
      uVar15 = (ulong)(uVar18 + 1);
      bVar19 = local_78 != puVar17;
      local_78 = local_78 + 1;
    } while (bVar19);
  }
  return;
}

Assistant:

void level_mesh::create_mappings(lw_face_vec& faces, lw_vmref_vec& vmrefs, xr_vmap_vec& vmaps,
		const xr_remapper& face_remap, const xr_remapper& vert_remap) const
{
	xr_uv_vmap* uv_vmap = 0;
	xr_face_uv_vmap* face_uv_vmap = 0;
	uint32_t vert_idx = vert_remap.min();
	for (std::vector<uint32_t>::const_iterator it = m_vertex_faces.begin() + vert_idx,
			end = m_vertex_faces.begin() + vert_remap.max() + 1; it != end; ++it, ++vert_idx) {
		if (*it == BAD_IDX)
			continue;
		uint32_t mapped_vert_idx = vert_remap[vert_idx];
		if (mapped_vert_idx == BAD_IDX)
			continue;

		lw_vmref vmref0;
		uint32_t tc0 = BAD_IDX, vmref0_idx = 0;
		for (uint32_t face_idx = *it; face_idx != BAD_IDX;) {
			const b_face& face = m_faces[face_idx];
			uint32_t mapped_face_idx = face_remap[face_idx];
			if (mapped_face_idx == BAD_IDX) {
				face_idx = face.next_face_idx(vert_idx);
				continue;
			}
			uint_fast32_t local_idx = face.local_vert_idx(vert_idx);
			uint32_t tc = face.tc[local_idx], vmref_idx;
			xr_assert(tc != BAD_IDX);
			if (tc0 == BAD_IDX) {
				if (uv_vmap == 0) {
					uv_vmap = new xr_uv_vmap("Texture");
					vmaps.push_back(uv_vmap);
				}
				vmref0.push_back(lw_vmref_entry(0, uv_vmap->add_uv(
						m_texcoords[tc0 = tc], mapped_vert_idx)));
				vmref0_idx = vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref0);
			} else if (tc0 == tc) {
				vmref_idx = vmref0_idx;
			} else {
				if (face_uv_vmap == 0) {
					face_uv_vmap = new xr_face_uv_vmap("Texture");
					vmaps.push_back(face_uv_vmap);
				}
				lw_vmref vmref;
				vmref.push_back(lw_vmref_entry(1, face_uv_vmap->add_uv(
						m_texcoords[tc], mapped_vert_idx, mapped_face_idx)));
				vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref);
			}
			faces[mapped_face_idx].ref[local_idx] = vmref_idx;
			face_idx = face.link[local_idx];
		}
	}
#if 0
	for (lw_face_vec_it it = faces.begin(); it != faces.end(); ++it) {
		if (it->ref0 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref1 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref2 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		xr_assert(it->ref0 < vmrefs.size());
		xr_assert(it->ref1 < vmrefs.size());
		xr_assert(it->ref2 < vmrefs.size());
	}
#endif
}